

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O1

void test_read_format_zip(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *paVar4;
  char *pcVar5;
  int64_t v2;
  size_t s;
  archive_entry *ae;
  size_t local_40;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_zip.zip");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'z',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  wVar2 = archive_read_open_filename(paVar4,"test_read_format_zip.zip",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'}',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",paVar4);
  verify_basic(paVar4,1);
  pcVar5 = slurpfile(&local_40,"test_read_format_zip.zip");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'\x82',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      paVar4);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      paVar4);
  iVar1 = read_open_memory(paVar4,pcVar5,local_40,0x1f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, p, s, 31)",paVar4);
  verify_basic(paVar4,0);
  extract_reference_file("test_read_format_zip_ux.zip");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'¿',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'À',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Á',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  wVar2 = archive_read_open_filename(paVar4,"test_read_format_zip_ux.zip",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Â',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",paVar4);
  verify_info_zip_ux(paVar4,1);
  pcVar5 = slurpfile(&local_40,"test_read_format_zip_ux.zip");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'Ç',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'È',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = read_open_memory(paVar4,pcVar5,local_40,0x6c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, p, s, 108)",paVar4);
  verify_info_zip_ux(paVar4,0);
  extract_reference_file("test_read_format_zip_length_at_end.zip");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'þ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ÿ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ā',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  wVar2 = archive_read_open_filename(paVar4,"test_read_format_zip_length_at_end.zip",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ā',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",paVar4);
  verify_extract_length_at_end(paVar4,1);
  pcVar5 = slurpfile(&local_40,"test_read_format_zip_length_at_end.zip");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'Ć',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ć',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = read_open_memory(paVar4,pcVar5,local_40,0x6c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ĉ',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, p, s, 108)",paVar4);
  verify_extract_length_at_end(paVar4,0);
  extract_reference_file("test_read_format_zip_symlink.zip");
  pcVar5 = slurpfile(&local_40,"test_read_format_zip_symlink.zip");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'Ě',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_read_support_format_zip(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ě',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",paVar4)
  ;
  iVar1 = read_open_memory_seek(paVar4,pcVar5,local_40,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ĝ',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, p, s, 1)",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ğ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ğ',"file","\"file\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ġ',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  wVar2 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ġ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ģ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ĥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ĥ',"symlink","\"symlink\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ħ',0xa000,"AE_IFLNK",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  v2 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ħ',0,"0",v2,"archive_entry_size(ae)",(void *)0x0);
  pcVar5 = archive_entry_symlink(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'Ĩ',"file","\"file\"",pcVar5,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ĩ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ī',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ĭ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Į',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",paVar4);
  return;
}

Assistant:

static void
test_basic(void)
{
	const char *refname = "test_read_format_zip.zip";
	struct archive *a;
	char *p;
	size_t s;

	extract_reference_file(refname);

	/* Verify with seeking reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 10240));
	verify_basic(a, 1);

	/* Verify with streaming reader. */
	p = slurpfile(&s, refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, p, s, 31));
	verify_basic(a, 0);
}